

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::Serialization<std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>_>::
     save(BinaryBuffer *bb,Vector *v)

{
  Bounds<float> *x;
  size_t s;
  long local_20;
  
  local_20 = (long)(v->super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 7;
  (*bb->_vptr_BinaryBuffer[2])(bb,&local_20,8);
  if (local_20 != 0) {
    x = (v->super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>)._M_impl.
        super__Vector_impl_data._M_start;
    save<diy::Bounds<float>>
              (bb,x,(long)(v->
                          super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)x >> 7);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }